

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int areadshort(char *file,short **data_ref,int *length_ref)

{
  uint uVar1;
  ssize_t sVar2;
  void *__buf;
  char *data;
  int offset;
  int size;
  int length;
  int fd;
  int *length_ref_local;
  short **data_ref_local;
  char *file_local;
  
  _length = length_ref;
  length_ref_local = (int *)data_ref;
  data_ref_local = (short **)file;
  size = open(file,0,0x1a4);
  if (size < 0) {
    fprintf(_stderr,"areadshort: %s: can\'t open\n",data_ref_local);
    perror("");
    file_local._4_4_ = -1;
  }
  else {
    sVar2 = read(size,&offset,4);
    if (sVar2 == 4) {
      offset = offset >> 0x18 & 0xffU | offset >> 8 & 0xff00U | (offset & 0xff00U) << 8 |
               offset << 0x18;
      if (length_ref_local == (int *)0x0) {
        close(size);
        if (_length != (int *)0x0) {
          *_length = offset;
        }
        file_local._4_4_ = offset;
      }
      else {
        uVar1 = offset << 1;
        __buf = malloc((ulong)uVar1);
        if (__buf == (void *)0x0) {
          fprintf(_stderr,"areadshort: %s: can\'t alloc data\n",data_ref_local);
          perror("");
          close(size);
          file_local._4_4_ = -1;
        }
        else {
          sVar2 = read(size,__buf,(long)(int)uVar1);
          if (sVar2 == (int)uVar1) {
            close(size);
            *(void **)length_ref_local = __buf;
            for (data._0_4_ = 0; (int)data < offset; data._0_4_ = (int)data + 1) {
              *(ushort *)(*(long *)length_ref_local + (long)(int)data * 2) =
                   *(ushort *)(*(long *)length_ref_local + (long)(int)data * 2) >> 8 |
                   *(short *)(*(long *)length_ref_local + (long)(int)data * 2) << 8;
            }
            *_length = offset;
            file_local._4_4_ = offset;
          }
          else {
            fprintf(_stderr,"areadshort: %s: can\'t read data\n",data_ref_local);
            perror("");
            close(size);
            free(__buf);
            file_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"areadshort: %s: can\'t read length (empty file?)\n",data_ref_local);
      perror("");
      close(size);
      file_local._4_4_ = -1;
    }
  }
  return file_local._4_4_;
}

Assistant:

int
areadshort (char *file,
	    short **data_ref,
	    int *length_ref)
{
  int             fd;
  int             length;
  int             size;
  int             offset;
  char           *data;

  if ((fd = open (file, O_RDONLY | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "areadshort: %s: can't open\n", file);
    perror("");
    return -1;
  }
  if (read (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "areadshort: %s: can't read length (empty file?)\n", file);
    perror("");
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);
  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
	  close(fd);
	  if (length_ref)
	    *length_ref = length;
	  return length;
  }

  size = length * sizeof (short);
  if (!(data = malloc ((unsigned) size)))
  {
    fprintf (stderr, "areadshort: %s: can't alloc data\n", file);
    perror("");
    close (fd);
    return -1;
  }
  if (read (fd, data, size) != size)
  {
    fprintf (stderr, "areadshort: %s: can't read data\n", file);
    perror("");
    close (fd);
    free (data);
    return -1;
  }
  close (fd);
  *data_ref = (short *) data;
  for(offset = 0; offset < length; offset++)
    SWAP_INT16(*data_ref + offset);
  *length_ref = length;
  return length;
}